

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O3

qpTestResult __thiscall deqp::ShaderIntegerMixRenderCase::test(ShaderIntegerMixRenderCase *this)

{
  deInt32 *pdVar1;
  TestLog *pTVar2;
  char *pcVar3;
  RenderContext *renderCtx;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  int i;
  int iVar7;
  deUint32 err;
  GLenum GVar8;
  undefined4 uVar9;
  undefined4 extraout_var;
  char *__s;
  mapped_type *pmVar10;
  ulong uVar11;
  TestError *pTVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  long *plVar20;
  int iVar21;
  GLSLVersion version;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  char *pcVar28;
  IVec4 *pIVar29;
  int i_2;
  int i_1;
  undefined1 auVar30 [16];
  GLuint tex;
  GLuint fbo;
  undefined1 local_4f80 [8];
  long *local_4f78;
  deUint32 *local_4f70;
  long local_4f68 [2];
  int local_4f58;
  long local_4f50;
  undefined4 local_4f44;
  TestLog *local_4f40;
  long *local_4f38;
  long local_4f30;
  long local_4f28 [2];
  long *local_4f18;
  long local_4f10;
  long local_4f08 [2];
  long *local_4ef8;
  long local_4ef0;
  long local_4ee8 [2];
  long *local_4ed8;
  long local_4ed0;
  long local_4ec8 [2];
  string fs_code;
  string vs_code;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  undefined1 local_4e48 [8];
  _Alloc_hider local_4e40;
  char local_4e30 [16];
  int local_4e20;
  VertexArrayPointer local_4e18;
  PrimitiveType local_4df8;
  undefined1 *local_4df0 [2];
  undefined1 local_4de0 [16];
  undefined4 local_4dd0;
  undefined8 local_4dc8;
  undefined8 uStack_4dc0;
  undefined4 local_4db8;
  deInt32 *local_4db0;
  PrimitiveType local_4da8;
  undefined1 *local_4da0 [2];
  undefined1 local_4d90 [16];
  undefined4 local_4d80;
  undefined8 local_4d78;
  undefined8 uStack_4d70;
  undefined4 local_4d68;
  deInt32 *local_4d60;
  PrimitiveType local_4d58;
  long *local_4d50 [2];
  long local_4d40 [2];
  undefined4 local_4d30;
  undefined8 local_4d28;
  undefined8 uStack_4d20;
  undefined4 local_4d18;
  deInt32 *local_4d10;
  ShaderProgram prog;
  deInt32 a [1024];
  deInt32 b [1024];
  float vertex [512];
  deUint32 pointIndices [256];
  deInt32 sel [1024];
  IVec4 expected [256];
  
  pTVar2 = ((this->super_ShaderIntegerMixCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  iVar7 = (*((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_4f50 = CONCAT44(extraout_var,iVar7);
  bVar6 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
  version = (this->super_ShaderIntegerMixCase).m_glslVersion;
  if (bVar6 && (1 < (int)version || !bVar6)) {
    pcVar28 = ::glcts::fixed_sample_locations_values + 1;
  }
  else {
    bVar6 = glu::ContextInfo::isExtensionSupported
                      (((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_shader_integer_mix");
    if (!bVar6) {
      return QP_TEST_RESULT_NOT_SUPPORTED;
    }
    version = (this->super_ShaderIntegerMixCase).m_glslVersion;
    pcVar28 = "#extension GL_EXT_shader_integer_mix: enable";
  }
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration(version);
  pdVar1 = a + 4;
  a._0_8_ = pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)a,"VERSION_DECL","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&args,(key_type *)a);
  pcVar3 = (char *)pmVar10->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar3,(ulong)__s);
  if ((deInt32 *)a._0_8_ != pdVar1) {
    operator_delete((void *)a._0_8_,a._16_8_ + 1);
  }
  a._0_8_ = pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)a,"EXTENSION_ENABLE","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&args,(key_type *)a);
  pcVar3 = (char *)pmVar10->_M_string_length;
  strlen(pcVar28);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar3,(ulong)pcVar28);
  if ((deInt32 *)a._0_8_ != pdVar1) {
    operator_delete((void *)a._0_8_,a._16_8_ + 1);
  }
  pcVar28 = this->type;
  a._0_8_ = pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)a,"TYPE","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&args,(key_type *)a);
  pcVar3 = (char *)pmVar10->_M_string_length;
  strlen(pcVar28);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar3,(ulong)pcVar28);
  if ((deInt32 *)a._0_8_ != pdVar1) {
    operator_delete((void *)a._0_8_,a._16_8_ + 1);
  }
  pdVar1 = b + 4;
  b._0_8_ = pdVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)b,
             "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nin vec2 vertex;\nin ivec4 vs_in_a;\nin ivec4 vs_in_b;\nin ivec4 vs_in_sel;\n\nflat out ivec4 fs_in_a;\nflat out ivec4 fs_in_b;\nflat out ivec4 fs_in_sel;\nflat out ivec4 fs_in_result;\n\nvoid main()\n{\n    fs_in_a = vs_in_a;\n    fs_in_b = vs_in_b;\n    fs_in_sel = vs_in_sel;\n\n    ${TYPE} a = ${TYPE}(vs_in_a);\n    ${TYPE} b = ${TYPE}(vs_in_b);\n    bvec4 sel = bvec4(vs_in_sel);\n    fs_in_result = ivec4(mix(a, b, sel));\n\n    gl_Position = vec4(vertex, 0, 1);\n    gl_PointSize = 4.;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)a,(string *)b);
  tcu::StringTemplate::specialize(&vs_code,(StringTemplate *)a,&args);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)a);
  if ((deInt32 *)b._0_8_ != pdVar1) {
    operator_delete((void *)b._0_8_,b._16_8_ + 1);
  }
  b._0_8_ = pdVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)b,
             "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nout ivec4 o;\n\nflat in ivec4 fs_in_a;\nflat in ivec4 fs_in_b;\nflat in ivec4 fs_in_sel;\nflat in ivec4 fs_in_result;\n\nuniform bool use_vs_data;\n\nvoid main()\n{\n    if (use_vs_data)\n        o = fs_in_result;\n    else {\n        ${TYPE} a = ${TYPE}(fs_in_a);\n        ${TYPE} b = ${TYPE}(fs_in_b);\n        bvec4 sel = bvec4(fs_in_sel);\n        o = ivec4(mix(a, b, sel));\n    }\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)a,(string *)b);
  tcu::StringTemplate::specialize(&fs_code,(StringTemplate *)a,&args);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)a);
  if ((deInt32 *)b._0_8_ != pdVar1) {
    operator_delete((void *)b._0_8_,b._16_8_ + 1);
  }
  renderCtx = ((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)b,vs_code._M_dataplus._M_p,(allocator<char> *)expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)sel,fs_code._M_dataplus._M_p,(allocator<char> *)vertex);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)a,0,0xac);
  a._176_9_ = SUB169((undefined1  [16])0x0,0);
  a._185_7_ = 0;
  a._192_9_ = SUB169((undefined1  [16])0x0,7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)a,(value_type *)b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(a + 6),(value_type *)sel);
  glu::ShaderProgram::ShaderProgram(&prog,renderCtx,(ProgramSources *)a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(a + 0x2c));
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (a + 0x24));
  lVar18 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)a + lVar18));
    lVar18 = lVar18 + -0x18;
  } while (lVar18 != -0x18);
  if ((deInt32 *)sel._0_8_ != sel + 4) {
    operator_delete((void *)sel._0_8_,sel._16_8_ + 1);
  }
  if ((deInt32 *)b._0_8_ != pdVar1) {
    operator_delete((void *)b._0_8_,b._16_8_ + 1);
  }
  local_4f40 = pTVar2;
  if (prog.m_program.m_info.linkOk != false) {
    bVar6 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
    if (!bVar6) {
      glwEnable(0x8642);
    }
    glwGenTextures(1,&tex);
    glwBindTexture(0xde1,tex);
    glwTexImage2D(0xde1,0,0x8d82,0x40,0x40,0,0x8d99,0x1404,(void *)0x0);
    glwBindTexture(0xde1,0);
    glwGenFramebuffers(1,&fbo);
    glwBindFramebuffer(0x8ca9,fbo);
    glwBindFramebuffer(0x8ca8,fbo);
    glwFramebufferTexture2D(0x8ca9,0x8ce0,0xde1,tex,0);
    err = (**(code **)(local_4f50 + 0x800))();
    glu::checkError(err,"Creation of rendering FBO failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
                    ,0x184);
    GVar8 = glwCheckFramebufferStatus(0x8ca9);
    if (GVar8 == 0x8cd5) {
      iVar17 = 0;
      glwViewport(0,0,0x40,0x40);
      memset(expected,0,0x1000);
      lVar18 = 0;
      uVar27 = 0;
      iVar7 = 0;
      iVar21 = 0;
      iVar22 = 0;
      iVar23 = 0;
      iVar24 = 0;
      iVar25 = 0;
      iVar26 = 0;
      do {
        b[lVar18] = iVar25 - 1U;
        iVar17 = iVar17 + -1;
        sel[lVar18] = uVar27 & 1;
        uVar4 = iVar25 - 1U;
        if ((uVar27 & 1) == 0) {
          uVar4 = uVar27;
        }
        b[lVar18 + 1] = iVar23 + -1;
        uVar19 = uVar27 >> 1 & 1;
        iVar14 = iVar23 + -1;
        if (uVar19 == 0) {
          iVar14 = iVar22;
        }
        sel[lVar18 + 1] = uVar19;
        uVar19 = uVar27 >> 2 & 1;
        sel[lVar18 + 2] = uVar19;
        b[lVar18 + 2] = iVar21 + -1;
        iVar13 = iVar21 + -1;
        if (uVar19 == 0) {
          iVar13 = iVar24;
        }
        uVar19 = uVar27 >> 3 & 1;
        sel[lVar18 + 3] = uVar19;
        expected[0].m_data[lVar18] = uVar4;
        expected[0].m_data[lVar18 + 1] = iVar14;
        expected[0].m_data[lVar18 + 2] = iVar13;
        iVar14 = iVar17;
        if (uVar19 == 0) {
          iVar14 = iVar26;
        }
        expected[0].m_data[lVar18 + 3] = iVar14;
        *(uint *)((long)pointIndices + lVar18) = uVar27;
        auVar30._4_4_ = iVar7;
        auVar30._0_4_ = uVar27 >> 1;
        auVar30._8_8_ = 0;
        auVar30 = auVar30 & _DAT_01b85340 | _DAT_01b85350;
        *(ulong *)((long)vertex + lVar18 * 2) =
             CONCAT44((float)auVar30._4_4_ * 0.015625 + -1.0,(float)auVar30._0_4_ * 0.015625 + -1.0)
        ;
        a[lVar18] = uVar27;
        a[lVar18 + 1] = iVar22;
        a[lVar18 + 2] = iVar24;
        a[lVar18 + 3] = iVar26;
        b[lVar18 + 3] = iVar17;
        iVar26 = iVar26 + 0xb;
        iVar25 = iVar25 + -0xb;
        iVar24 = iVar24 + 7;
        iVar23 = iVar23 + -7;
        iVar22 = iVar22 + 5;
        iVar21 = iVar21 + -5;
        iVar7 = iVar7 + 8;
        uVar27 = uVar27 + 1;
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x400);
      if (*this->type == 'b') {
        uVar11 = 0;
        do {
          a[uVar11] = a[uVar11] & 1;
          b[uVar11] = b[uVar11] & 1;
          uVar15 = uVar11 >> 2 & 0x3fffffff;
          uVar5 = *(ulong *)(expected[uVar15].m_data + 2);
          *(ulong *)expected[uVar15].m_data = *(ulong *)expected[uVar15].m_data & 0x100000001;
          *(ulong *)(expected[uVar15].m_data + 2) = uVar5 & 0x100000001;
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x400);
      }
      local_4f18 = local_4f08;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f18,"vertex","");
      pTVar2 = local_4f40;
      pIVar29 = expected;
      local_4f80._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
      local_4f78 = local_4f68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f78,local_4f18,local_4f10 + (long)local_4f18);
      local_4f58 = 0;
      local_4e48._0_4_ = local_4f80._0_4_;
      local_4e40._M_p = local_4e30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e40,local_4f78,(long)local_4f70 + (long)local_4f78);
      local_4e20 = local_4f58;
      local_4e18.componentType = VTX_COMP_FLOAT;
      local_4e18.convert = VTX_COMP_CONVERT_NONE;
      local_4e18.numComponents = 2;
      local_4e18.numElements = 0x100;
      local_4e18.stride = 0;
      local_4e18.data = vertex;
      if (local_4f78 != local_4f68) {
        operator_delete(local_4f78,local_4f68[0] + 1);
      }
      local_4ed8 = local_4ec8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ed8,"vs_in_a","");
      local_4f80._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
      local_4f78 = local_4f68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f78,local_4ed8,local_4ed0 + (long)local_4ed8);
      local_4f58 = 0;
      local_4df8 = local_4f80._0_4_;
      local_4df0[0] = local_4de0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4df0,local_4f78,(long)local_4f70 + (long)local_4f78);
      local_4dd0 = local_4f58;
      local_4dc8 = 5;
      uStack_4dc0 = 0x10000000004;
      local_4db8 = 0;
      local_4db0 = a;
      if (local_4f78 != local_4f68) {
        operator_delete(local_4f78,local_4f68[0] + 1);
      }
      local_4f38 = local_4f28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f38,"vs_in_b","");
      local_4f80._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
      local_4f78 = local_4f68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f78,local_4f38,local_4f30 + (long)local_4f38);
      local_4f58 = 0;
      local_4da8 = local_4f80._0_4_;
      local_4da0[0] = local_4d90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4da0,local_4f78,(long)local_4f70 + (long)local_4f78);
      local_4d80 = local_4f58;
      local_4d78 = 5;
      uStack_4d70 = 0x10000000004;
      local_4d68 = 0;
      local_4d60 = b;
      if (local_4f78 != local_4f68) {
        operator_delete(local_4f78,local_4f68[0] + 1);
      }
      local_4ef8 = local_4ee8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ef8,"vs_in_sel","");
      local_4f80._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
      local_4f78 = local_4f68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f78,local_4ef8,local_4ef0 + (long)local_4ef8);
      local_4f58 = 0;
      local_4d58 = local_4f80._0_4_;
      plVar20 = local_4d40;
      local_4d50[0] = plVar20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4d50,local_4f78,(long)local_4f70 + (long)local_4f78);
      local_4d30 = local_4f58;
      local_4d28 = 5;
      uStack_4d20 = 0x10000000004;
      local_4d18 = 0;
      local_4d10 = sel;
      if (local_4f78 != local_4f68) {
        operator_delete(local_4f78,local_4f68[0] + 1);
      }
      if (local_4ef8 != local_4ee8) {
        operator_delete(local_4ef8,local_4ee8[0] + 1);
      }
      if (local_4f38 != local_4f28) {
        operator_delete(local_4f38,local_4f28[0] + 1);
      }
      if (local_4ed8 != local_4ec8) {
        operator_delete(local_4ed8,local_4ec8[0] + 1);
      }
      if (local_4f18 != local_4f08) {
        operator_delete(local_4f18,local_4f08[0] + 1);
      }
      uVar9 = (**(code **)(local_4f50 + 0xb48))(prog.m_program.m_program);
      (**(code **)(local_4f50 + 0x1680))(prog.m_program.m_program);
      glwClearBufferiv(0x1800,0,test::clear);
      (**(code **)(local_4f50 + 0x14f0))(uVar9,0);
      local_4f80._0_4_ = PRIMITIVETYPE_POINTS;
      local_4f80._4_4_ = 0x100;
      local_4f78 = (long *)CONCAT44(local_4f78._4_4_,INDEXTYPE_UINT32);
      local_4f70 = pointIndices;
      local_4f44 = uVar9;
      glu::draw(((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx,
                prog.m_program.m_program,4,(VertexArrayBinding *)local_4e48,
                (PrimitiveList *)local_4f80,(DrawUtilCallback *)0x0);
      bVar16 = 1;
      lVar18 = 0;
      do {
        bVar6 = probe_pixel(this,pTVar2,"Fragment",(int)((vertex[lVar18 * 2] + 1.0) * 64.0 * 0.5),
                            (int)((vertex[lVar18 * 2 + 1] + 1.0) * 64.0 * 0.5),pIVar29);
        bVar16 = bVar16 & bVar6;
        lVar18 = lVar18 + 1;
        pIVar29 = pIVar29 + 1;
      } while (lVar18 != 0x100);
      (**(code **)(local_4f50 + 0x14f0))(local_4f44,1);
      local_4f80._0_4_ = PRIMITIVETYPE_POINTS;
      local_4f80._4_4_ = 0x100;
      local_4f78 = (long *)CONCAT44(local_4f78._4_4_,INDEXTYPE_UINT32);
      local_4f70 = pointIndices;
      glu::draw(((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx,
                prog.m_program.m_program,4,(VertexArrayBinding *)local_4e48,
                (PrimitiveList *)local_4f80,(DrawUtilCallback *)0x0);
      pIVar29 = expected;
      lVar18 = 0;
      do {
        bVar6 = probe_pixel(this,pTVar2,"Vertex",(int)((vertex[lVar18 * 2] + 1.0) * 64.0 * 0.5),
                            (int)((vertex[lVar18 * 2 + 1] + 1.0) * 64.0 * 0.5),pIVar29);
        bVar16 = bVar16 & bVar6;
        lVar18 = lVar18 + 1;
        pIVar29 = pIVar29 + 1;
      } while (lVar18 != 0x100);
      glwDeleteFramebuffers(1,&fbo);
      glwDeleteTextures(1,&tex);
      lVar18 = -0x140;
      do {
        if (plVar20 != (long *)plVar20[-2]) {
          operator_delete((long *)plVar20[-2],*plVar20 + 1);
        }
        plVar20 = plVar20 + -10;
        lVar18 = lVar18 + 0x50;
      } while (lVar18 != 0);
      glu::ShaderProgram::~ShaderProgram(&prog);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fs_code._M_dataplus._M_p != &fs_code.field_2) {
        operator_delete(fs_code._M_dataplus._M_p,fs_code.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vs_code._M_dataplus._M_p != &vs_code.field_2) {
        operator_delete(vs_code._M_dataplus._M_p,vs_code.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&args._M_t);
      return (uint)(bVar16 ^ 1);
    }
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Framebuffer not complete.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
               ,0x187);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::operator<<(pTVar2,&prog);
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar12,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
             ,0x16e);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

virtual qpTestResult test()
	{
		static const char vs_template[] = "${VERSION_DECL}\n"
										  "${EXTENSION_ENABLE}\n"
										  "\n"
										  "in vec2 vertex;\n"
										  "in ivec4 vs_in_a;\n"
										  "in ivec4 vs_in_b;\n"
										  "in ivec4 vs_in_sel;\n"
										  "\n"
										  "flat out ivec4 fs_in_a;\n"
										  "flat out ivec4 fs_in_b;\n"
										  "flat out ivec4 fs_in_sel;\n"
										  "flat out ivec4 fs_in_result;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    fs_in_a = vs_in_a;\n"
										  "    fs_in_b = vs_in_b;\n"
										  "    fs_in_sel = vs_in_sel;\n"
										  "\n"
										  "    ${TYPE} a = ${TYPE}(vs_in_a);\n"
										  "    ${TYPE} b = ${TYPE}(vs_in_b);\n"
										  "    bvec4 sel = bvec4(vs_in_sel);\n"
										  "    fs_in_result = ivec4(mix(a, b, sel));\n"
										  "\n"
										  "    gl_Position = vec4(vertex, 0, 1);\n"
										  "    gl_PointSize = 4.;\n"
										  "}\n";

		static const char fs_template[] = "${VERSION_DECL}\n"
										  "${EXTENSION_ENABLE}\n"
										  "\n"
										  "out ivec4 o;\n"
										  "\n"
										  "flat in ivec4 fs_in_a;\n"
										  "flat in ivec4 fs_in_b;\n"
										  "flat in ivec4 fs_in_sel;\n"
										  "flat in ivec4 fs_in_result;\n"
										  "\n"
										  "uniform bool use_vs_data;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    if (use_vs_data)\n"
										  "        o = fs_in_result;\n"
										  "    else {\n"
										  "        ${TYPE} a = ${TYPE}(fs_in_a);\n"
										  "        ${TYPE} b = ${TYPE}(fs_in_b);\n"
										  "        bvec4 sel = bvec4(fs_in_sel);\n"
										  "        o = ivec4(mix(a, b, sel));\n"
										  "    }\n"
										  "}\n";

		TestLog&			  log  = m_testCtx.getLog();
		const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
		bool				  pass = true;
		const char*			  extension_enable;
		bool				  is_es = glslVersionIsES(m_glslVersion);

		if ((is_es && (m_glslVersion < glu::GLSL_VERSION_310_ES)) || !is_es)
		{
			/* For versions that do not support this feature in Core it must be exposed via an extension. */
			if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_integer_mix"))
			{
				return QP_TEST_RESULT_NOT_SUPPORTED;
			}

			extension_enable = "#extension GL_EXT_shader_integer_mix: enable";
		}
		else
		{
			extension_enable = "";
		}

		/* Generate the specialization of the shader for the specific
		 * type being tested.
		 */
		std::map<std::string, std::string> args;

		args["VERSION_DECL"]	 = glu::getGLSLVersionDeclaration(m_glslVersion);
		args["EXTENSION_ENABLE"] = extension_enable;
		args["TYPE"]			 = type;

		std::string vs_code = tcu::StringTemplate(vs_template).specialize(args);

		std::string fs_code = tcu::StringTemplate(fs_template).specialize(args);

		glu::ShaderProgram prog(m_context.getRenderContext(),
								glu::makeVtxFragSources(vs_code.c_str(), fs_code.c_str()));

		if (!prog.isOk())
		{
			log << prog;
			TCU_FAIL("Compile failed");
		}

		if (!glslVersionIsES(m_glslVersion))
			glEnable(GL_PROGRAM_POINT_SIZE);

		/* Generate an integer FBO for rendering.
		 */
		GLuint fbo;
		GLuint tex;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glTexImage2D(GL_TEXTURE_2D, 0 /* level */, GL_RGBA32I, width, height, 0 /* border */, GL_RGBA_INTEGER, GL_INT,
					 NULL /* data */);
		glBindTexture(GL_TEXTURE_2D, 0);

		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo);
		glBindFramebuffer(GL_READ_FRAMEBUFFER, fbo);
		glFramebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0 /* level */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Creation of rendering FBO failed.");

		if (glCheckFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			TCU_FAIL("Framebuffer not complete.");

		glViewport(0, 0, width, height);

		/* Fill a VBO with some vertex data.
		 */
		deUint32   pointIndices[256];
		float	  vertex[DE_LENGTH_OF_ARRAY(pointIndices) * 2];
		deInt32	a[DE_LENGTH_OF_ARRAY(pointIndices) * 4];
		deInt32	b[DE_LENGTH_OF_ARRAY(a)];
		deInt32	sel[DE_LENGTH_OF_ARRAY(a)];
		tcu::IVec4 expected[DE_LENGTH_OF_ARRAY(pointIndices)];

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			pointIndices[i] = deUint16(i);

			const int x = (i / 16) * (width / 16) + (4 / 2);
			const int y = (i % 16) * (height / 16) + (4 / 2);

			vertex[(i * 2) + 0] = float(x) * 2.0f / float(width) - 1.0f;
			vertex[(i * 2) + 1] = float(y) * 2.0f / float(height) - 1.0f;

			a[(i * 4) + 0] = i;
			a[(i * 4) + 1] = i * 5;
			a[(i * 4) + 2] = i * 7;
			a[(i * 4) + 3] = i * 11;

			b[(i * 4) + 0] = ~a[(i * 4) + 3];
			b[(i * 4) + 1] = ~a[(i * 4) + 2];
			b[(i * 4) + 2] = ~a[(i * 4) + 1];
			b[(i * 4) + 3] = ~a[(i * 4) + 0];

			sel[(i * 4) + 0] = (i >> 0) & 1;
			sel[(i * 4) + 1] = (i >> 1) & 1;
			sel[(i * 4) + 2] = (i >> 2) & 1;
			sel[(i * 4) + 3] = (i >> 3) & 1;

			expected[i] = tcu::IVec4(
				sel[(i * 4) + 0] ? b[(i * 4) + 0] : a[(i * 4) + 0], sel[(i * 4) + 1] ? b[(i * 4) + 1] : a[(i * 4) + 1],
				sel[(i * 4) + 2] ? b[(i * 4) + 2] : a[(i * 4) + 2], sel[(i * 4) + 3] ? b[(i * 4) + 3] : a[(i * 4) + 3]);
		}

		/* Mask off all but the least significant bit for boolean
		 * types.
		 */
		if (type[0] == 'b')
		{
			for (int i = 0; i < DE_LENGTH_OF_ARRAY(a); i++)
			{
				a[i] &= 1;
				b[i] &= 1;

				expected[i / 4][0] &= 1;
				expected[i / 4][1] &= 1;
				expected[i / 4][2] &= 1;
				expected[i / 4][3] &= 1;
			}
		}

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("vertex", 2, DE_LENGTH_OF_ARRAY(pointIndices), 0, vertex),
			glu::va::Int32("vs_in_a", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, a),
			glu::va::Int32("vs_in_b", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, b),
			glu::va::Int32("vs_in_sel", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, sel)
		};

		/* Render and verify the results.  Rendering happens twice.
		 * The first time, use_vs_data is false, and the mix() result
		 * from the fragment shader is used.  The second time,
		 * use_vs_data is true, and the mix() result from the vertex
		 * shader is used.
		 */
		const GLint loc = gl.getUniformLocation(prog.getProgram(), "use_vs_data");
		gl.useProgram(prog.getProgram());

		static const GLint clear[] = { 1, 2, 3, 4 };
		glClearBufferiv(GL_COLOR, 0, clear);

		gl.uniform1i(loc, 0);
		glu::draw(m_context.getRenderContext(), prog.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
				  glu::pr::Points(DE_LENGTH_OF_ARRAY(pointIndices), pointIndices));

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			const int x = int((vertex[(i * 2) + 0] + 1.0f) * float(width) / 2.0f);
			const int y = int((vertex[(i * 2) + 1] + 1.0f) * float(height) / 2.0f);

			pass = probe_pixel(log, "Fragment", x, y, expected[i]) && pass;
		}

		gl.uniform1i(loc, 1);
		glu::draw(m_context.getRenderContext(), prog.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
				  glu::pr::Points(DE_LENGTH_OF_ARRAY(pointIndices), pointIndices));

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			const int x = int((vertex[(i * 2) + 0] + 1.0f) * float(width) / 2.0f);
			const int y = int((vertex[(i * 2) + 1] + 1.0f) * float(height) / 2.0f);

			pass = probe_pixel(log, "Vertex", x, y, expected[i]) && pass;
		}

		glDeleteFramebuffers(1, &fbo);
		glDeleteTextures(1, &tex);

		return pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL;
	}